

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-all.cc
# Opt level: O0

AssertionResult
testing::internal::DoubleNearPredFormat
          (char *expr1,char *expr2,char *abs_error_expr,double val1,double val2,double abs_error)

{
  AssertionResult *this;
  AssertionResult *other;
  AssertionResult *this_00;
  AssertionResult *value;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX;
  undefined8 in_RDI;
  double in_XMM0_Qa;
  undefined4 in_XMM1_Da;
  undefined4 in_XMM1_Db;
  double in_XMM2_Qa;
  AssertionResult AVar2;
  double diff;
  char (*in_stack_ffffffffffffff08) [24];
  AssertionResult *in_stack_ffffffffffffff10;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> sVar1
  ;
  
  if (in_XMM2_Qa < ABS(in_XMM0_Qa - (double)CONCAT44(in_XMM1_Db,in_XMM1_Da))) {
    AssertionFailure();
    AssertionResult::operator<<(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    AssertionResult::operator<<(in_stack_ffffffffffffff10,(char **)in_stack_ffffffffffffff08);
    AssertionResult::operator<<(in_stack_ffffffffffffff10,(char (*) [6])in_stack_ffffffffffffff08);
    AssertionResult::operator<<(in_stack_ffffffffffffff10,(char **)in_stack_ffffffffffffff08);
    AssertionResult::operator<<(in_stack_ffffffffffffff10,(char (*) [5])in_stack_ffffffffffffff08);
    AssertionResult::operator<<(in_stack_ffffffffffffff10,(double *)in_stack_ffffffffffffff08);
    AssertionResult::operator<<(in_stack_ffffffffffffff10,(char (*) [17])in_stack_ffffffffffffff08);
    AssertionResult::operator<<(in_stack_ffffffffffffff10,(char **)in_stack_ffffffffffffff08);
    AssertionResult::operator<<(in_stack_ffffffffffffff10,(char (*) [9])in_stack_ffffffffffffff08);
    AssertionResult::operator<<(in_stack_ffffffffffffff10,(char **)in_stack_ffffffffffffff08);
    AssertionResult::operator<<(in_stack_ffffffffffffff10,(char (*) [15])in_stack_ffffffffffffff08);
    AssertionResult::operator<<(in_stack_ffffffffffffff10,(double *)in_stack_ffffffffffffff08);
    this = AssertionResult::operator<<
                     (in_stack_ffffffffffffff10,(char (*) [3])in_stack_ffffffffffffff08);
    other = AssertionResult::operator<<
                      (in_stack_ffffffffffffff10,(char **)in_stack_ffffffffffffff08);
    this_00 = AssertionResult::operator<<
                        (in_stack_ffffffffffffff10,(char (*) [15])in_stack_ffffffffffffff08);
    value = AssertionResult::operator<<(this_00,(double *)in_stack_ffffffffffffff08);
    AssertionResult::operator<<(this_00,&value->success_);
    AssertionResult::operator<<(this_00,(char **)value);
    AssertionResult::operator<<(this_00,&value->success_);
    AssertionResult::operator<<(this_00,(double *)value);
    AssertionResult::operator<<(this_00,&value->success_);
    AssertionResult::AssertionResult(this,other);
    AssertionResult::~AssertionResult((AssertionResult *)0x133814);
    sVar1.ptr_ = extraout_RDX;
  }
  else {
    AVar2 = AssertionSuccess();
    sVar1 = AVar2.message_.ptr_;
  }
  AVar2.message_.ptr_ = sVar1.ptr_;
  AVar2._0_8_ = in_RDI;
  return AVar2;
}

Assistant:

AssertionResult DoubleNearPredFormat(const char* expr1,
                                     const char* expr2,
                                     const char* abs_error_expr,
                                     double val1,
                                     double val2,
                                     double abs_error) {
  const double diff = fabs(val1 - val2);
  if (diff <= abs_error) return AssertionSuccess();

  // TODO(wan): do not print the value of an expression if it's
  // already a literal.
  return AssertionFailure()
      << "The difference between " << expr1 << " and " << expr2
      << " is " << diff << ", which exceeds " << abs_error_expr << ", where\n"
      << expr1 << " evaluates to " << val1 << ",\n"
      << expr2 << " evaluates to " << val2 << ", and\n"
      << abs_error_expr << " evaluates to " << abs_error << ".";
}